

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CLogerManager::Run(CLogerManager *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  size_t len;
  int local_270;
  int local_26c;
  int i_2;
  int i_1;
  size_t writeLen;
  tm tt;
  bool needChageFile;
  bool sameday;
  LoggerInfo *curLogger;
  int needFlush [10];
  char *pWriteBuf;
  LogData *pLog;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  int local_24;
  CLogerManager *pCStack_20;
  int i;
  CLogerManager *this_local;
  
  this->m_bRuning = true;
  this->m_loggers[0]._enable = true;
  pCStack_20 = this;
  (*(this->super_CThread)._vptr_CThread[8])
            (this,0,4,"-----------------  log thread runing...   ----------------------------");
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    if ((this->m_loggers[local_24]._enable & 1U) != 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar3 = std::operator<<(local_1a0," logger id=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
      poVar3 = std::operator<<(poVar3," path=");
      poVar3 = std::operator<<(poVar3,(string *)&this->m_loggers[local_24]._path);
      poVar3 = std::operator<<(poVar3," name=");
      poVar3 = std::operator<<(poVar3,(string *)(this->m_loggers + local_24));
      poVar3 = std::operator<<(poVar3," level=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_loggers[local_24]._level);
      poVar3 = std::operator<<(poVar3," display=");
      std::ostream::operator<<(poVar3,(bool)(this->m_loggers[local_24]._display & 1));
      std::__cxx11::stringstream::str();
      uVar4 = std::__cxx11::string::c_str();
      (*(this->super_CThread)._vptr_CThread[8])(this,0,4,uVar4);
      std::__cxx11::string::~string((string *)&pLog);
      std::__cxx11::stringstream::~stringstream(local_1b0);
    }
  }
  CSem::Post(&this->m_semaphore);
  pWriteBuf = (char *)0x0;
  needFlush._32_8_ = operator_new__(0xa00);
  memset(&curLogger,0,0x28);
  do {
    while( true ) {
      while( true ) {
        while (bVar2 = PopLog(this,(LogData **)&pWriteBuf), !bVar2) {
          for (local_26c = 0; local_26c < 10; local_26c = local_26c + 1) {
            if (((this->m_loggers[local_26c]._enable & 1U) != 0) &&
               (0 < needFlush[(long)local_26c + -2])) {
              CLog4zFile::Flush(&this->m_loggers[local_26c]._handle);
              needFlush[(long)local_26c + -2] = 0;
            }
          }
          if (((this->m_bRuning & 1U) == 0) &&
             (bVar2 = std::__cxx11::
                      list<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>::
                      empty(&this->m_logs), bVar2)) {
            for (local_270 = 0; local_270 < 10; local_270 = local_270 + 1) {
              if ((this->m_loggers[local_270]._enable & 1U) != 0) {
                this->m_loggers[local_270]._enable = false;
                CLog4zFile::Close(&this->m_loggers[local_270]._handle);
              }
            }
            if (needFlush._32_8_ != 0) {
              operator_delete__((void *)needFlush._32_8_);
            }
            return;
          }
          SleepMillisecond(100);
        }
        this->m_ullStatusTotalPopLog = this->m_ullStatusTotalPopLog + 1;
        iVar1 = *(int *)pWriteBuf;
        if (((this->m_loggers[iVar1]._enable & 1U) != 0) &&
           (this->m_loggers[iVar1]._level <= *(int *)(pWriteBuf + 4))) break;
        if (pWriteBuf != (char *)0x0) {
          operator_delete(pWriteBuf,0x818);
        }
        pWriteBuf = (char *)0x0;
      }
      tt.tm_zone._7_1_ =
           IsSameDay(*(time_t *)(pWriteBuf + 8),this->m_loggers[iVar1]._curFileCreateTime);
      tt.tm_zone._6_1_ =
           this->m_loggers[iVar1]._limitsize << 0x14 < this->m_loggers[iVar1]._curWriteLen;
      bVar2 = CLog4zFile::IsOpen(&this->m_loggers[iVar1]._handle);
      if ((!bVar2) || (((tt.tm_zone._7_1_ & 1) == 0 || ((tt.tm_zone._6_1_ & 1) != 0)))) break;
LAB_001207ed:
      bVar2 = TimeToTm((time_t *)(pWriteBuf + 8),(tm *)&writeLen);
      if (!bVar2) {
        memset(&writeLen,0,0x38);
      }
      sprintf((char *)needFlush._32_8_,"%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",
              (ulong)(tt.tm_mday + 0x76c),(ulong)(tt.tm_hour + 1),(ulong)(uint)tt.tm_min,
              (ulong)(uint)tt.tm_sec,writeLen._4_4_,(undefined4)writeLen,
              *(undefined4 *)(pWriteBuf + 0x10),
              *(undefined8 *)(LOG_STRING + (long)*(int *)(pWriteBuf + 4) * 8),pWriteBuf + 0x14);
      len = strlen((char *)needFlush._32_8_);
      CLog4zFile::Write(&this->m_loggers[iVar1]._handle,(char *)needFlush._32_8_,len);
      this->m_loggers[iVar1]._curWriteLen = (int)len + this->m_loggers[iVar1]._curWriteLen;
      needFlush[(long)*(int *)pWriteBuf + -2] = needFlush[(long)*(int *)pWriteBuf + -2] + 1;
      this->m_ullStatusTotalWriteFileCount = this->m_ullStatusTotalWriteFileCount + 1;
      this->m_ullStatusTotalWriteFileBytes = len + this->m_ullStatusTotalWriteFileBytes;
      if (pWriteBuf != (char *)0x0) {
        operator_delete(pWriteBuf,0x818);
      }
      pWriteBuf = (char *)0x0;
    }
    if ((tt.tm_zone._7_1_ & 1) == 0) {
      this->m_loggers[iVar1]._curFileIndex = 0;
      this->m_loggers[iVar1]._curWriteLen = 0;
    }
    else if ((tt.tm_zone._6_1_ & 1) != 0) {
      this->m_loggers[iVar1]._curFileIndex = this->m_loggers[iVar1]._curFileIndex + 1;
      this->m_loggers[iVar1]._curWriteLen = 0;
    }
    this->m_loggers[iVar1]._curFileCreateTime = *(time_t *)(pWriteBuf + 8);
    bVar2 = OpenLogger(this,*(LoggerId *)pWriteBuf);
    if (bVar2) goto LAB_001207ed;
    this->m_loggers[iVar1]._enable = false;
    if (pWriteBuf != (char *)0x0) {
      operator_delete(pWriteBuf,0x818);
    }
    pWriteBuf = (char *)0x0;
    ShowColorText("log4z: Run can not update file, open file false! \r\n",5);
  } while( true );
}

Assistant:

virtual void Run()
	{
		m_bRuning = true;
		m_loggers[LOG4Z_MAIN_LOGGER_ID]._enable = true;
		PushLog(0, LOG_LEVEL_ALARM, "-----------------  log thread runing...   ----------------------------");
		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				std::stringstream ss;
				ss <<" logger id=" <<i
				   <<" path=" <<m_loggers[i]._path
				   <<" name=" <<m_loggers[i]._name
				   <<" level=" << m_loggers[i]._level
				   <<" display=" << m_loggers[i]._display;
				PushLog(0, LOG_LEVEL_ALARM, ss.str().c_str());
			}
		}

		m_semaphore.Post();


		LogData * pLog = NULL;
		char *pWriteBuf = new char[LOG4Z_LOG_BUF_SIZE + 512];
		int needFlush[LOG4Z_LOGGER_MAX] = {0};
		while (true)
		{
			while(PopLog(pLog))
			{
				//
				m_ullStatusTotalPopLog ++;
				//discard
				LoggerInfo & curLogger = m_loggers[pLog->_id];
				if (!curLogger._enable || pLog->_level <curLogger._level  )
				{
					delete pLog;
					pLog = NULL;
					continue;
				}

				//update file
				if (LOG4Z_WRITE_TO_FILE)
				{
					bool sameday = IsSameDay(pLog->_time, curLogger._curFileCreateTime);
					bool needChageFile = curLogger._curWriteLen > curLogger._limitsize*1024*1024;
					if (!curLogger._handle.IsOpen()
						|| !sameday
						|| needChageFile)
					{
						if (!sameday)
						{
							curLogger._curFileIndex = 0;
							curLogger._curWriteLen = 0;
						}
						else if ( needChageFile)
						{
							curLogger._curFileIndex ++;
							curLogger._curWriteLen = 0;
						}
						curLogger._curFileCreateTime = pLog->_time;
						if (!OpenLogger(pLog->_id))
						{
							curLogger._enable = false;
							delete pLog;
							pLog = NULL;
							ShowColorText("log4z: Run can not update file, open file false! \r\n", LOG_LEVEL_FATAL);
							continue;
						}
					}
				}

				//record
				tm tt;
				if (!TimeToTm(pLog->_time, &tt))
				{
					memset(&tt, 0, sizeof(tt));
				}
				sprintf(pWriteBuf, "%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",
					tt.tm_year+1900, tt.tm_mon+1, tt.tm_mday, tt.tm_hour, tt.tm_min, tt.tm_sec, pLog->_precise,
					LOG_STRING[pLog->_level], pLog->_content);

				if (LOG4Z_WRITE_TO_FILE)
				{
					size_t writeLen = strlen(pWriteBuf);
					curLogger._handle.Write(pWriteBuf, writeLen);
					curLogger._curWriteLen += (unsigned int)writeLen;
					needFlush[pLog->_id] ++;
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}
				else
				{
					size_t writeLen = strlen(pWriteBuf);
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}

				if (curLogger._display && !LOG4Z_SYNCHRONOUS_DISPLAY)
				{
					ShowColorText(pWriteBuf, pLog->_level);
				}



				delete pLog;
				pLog = NULL;
			}

			for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
			{
				if (m_loggers[i]._enable && needFlush[i] > 0)
				{
					m_loggers[i]._handle.Flush();
					needFlush[i] = 0;
				}
			}

			//! quit
			if (!m_bRuning && m_logs.empty())
			{
				break;
			}
			//! delay.
			SleepMillisecond(100);
		}

		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				m_loggers[i]._enable = false;
				m_loggers[i]._handle.Close();
			}
		}
		delete []pWriteBuf;
		pWriteBuf = NULL;

	}